

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_RenderContent * ON_RenderContent::Cast(ON_Object *p)

{
  bool bVar1;
  ON_RenderContent *local_18;
  ON_Object *p_local;
  
  if ((p == (ON_Object *)0x0) ||
     (bVar1 = ON_Object::IsKindOf(p,&m_ON_RenderContent_class_rtti),
     local_18 = (ON_RenderContent *)p, !bVar1)) {
    local_18 = (ON_RenderContent *)0x0;
  }
  return local_18;
}

Assistant:

ON_RenderContent::ON_RenderContent(const wchar_t* kind)
  :
  ON_ModelComponent(ON_ModelComponent::Type::RenderContent)
{
  _private = new (_PRIVATE) ON_RenderContentPrivate(*this, kind); PRIVATE_CHECK(ON_RenderContentPrivate);

  // Set a unique instance id.
  ON_UUID uuid;
  ON_CreateUuid(uuid);
  SetId(uuid);

  // Set the plug-in id to the RDK plug-in id.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_PLUG_IN_ID, RdkPlugInId());

  // Set the render engine id to 'universal'.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_RENDER_ENGINE_ID, ON_UniversalRenderEngineId);
}